

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

uint32_t fs_ask(aec_stream_conflict *strm)

{
  byte *pbVar1;
  uint32_t uVar2;
  aec_stream_conflict *strm_local;
  
  uVar2 = bits_ask(strm,1);
  if (uVar2 == 0) {
    strm_local._4_4_ = 0;
  }
  else {
    while ((strm->state->acc & 1L << ((char)strm->state->bitp - 1U & 0x3f)) == 0) {
      if (strm->state->bitp == 1) {
        if (strm->avail_in == 0) {
          return 0;
        }
        strm->avail_in = strm->avail_in - 1;
        strm->state->acc = strm->state->acc << 8;
        pbVar1 = strm->next_in;
        strm->next_in = pbVar1 + 1;
        strm->state->acc = (ulong)*pbVar1 | strm->state->acc;
        strm->state->bitp = strm->state->bitp + 8;
      }
      strm->state->fs = strm->state->fs + 1;
      strm->state->bitp = strm->state->bitp + -1;
    }
    strm_local._4_4_ = 1;
  }
  return strm_local._4_4_;
}

Assistant:

static inline uint32_t fs_ask(struct aec_stream *strm)
{
    if (bits_ask(strm, 1) == 0)
        return 0;
    while ((strm->state->acc & (UINT64_C(1) << (strm->state->bitp - 1))) == 0) {
        if (strm->state->bitp == 1) {
            if (strm->avail_in == 0)
                return 0;
            strm->avail_in--;
            strm->state->acc <<= 8;
            strm->state->acc |= *strm->next_in++;
            strm->state->bitp += 8;
        }
        strm->state->fs++;
        strm->state->bitp--;
    }
    return 1;
}